

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEncode(Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,CLzmaEncProps *props,
                       Byte *propsEncoded,SizeT *propsSize,int writeEndMark,
                       ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  CLzmaEncHandle pp;
  SRes local_4c;
  SRes res;
  CLzmaEnc *p;
  Byte *propsEncoded_local;
  CLzmaEncProps *props_local;
  SizeT srcLen_local;
  Byte *src_local;
  SizeT *destLen_local;
  Byte *dest_local;
  
  pp = LzmaEnc_Create(alloc);
  if (pp == (CLzmaEncHandle)0x0) {
    dest_local._4_4_ = 2;
  }
  else {
    local_4c = LzmaEnc_SetProps(pp,props);
    if ((local_4c == 0) &&
       (local_4c = LzmaEnc_WriteProperties(pp,propsEncoded,propsSize), local_4c == 0)) {
      local_4c = LzmaEnc_MemEncode(pp,dest,destLen,src,srcLen,writeEndMark,progress,alloc,allocBig);
    }
    LzmaEnc_Destroy(pp,alloc,allocBig);
    dest_local._4_4_ = local_4c;
  }
  return dest_local._4_4_;
}

Assistant:

SRes LzmaEncode(Byte* dest, SizeT* destLen, const Byte* src, SizeT srcLen,
                const CLzmaEncProps* props, Byte* propsEncoded, SizeT* propsSize, int writeEndMark,
                ICompressProgress* progress, ISzAlloc* alloc, ISzAlloc* allocBig) {
  CLzmaEnc* p = (CLzmaEnc*)LzmaEnc_Create(alloc);
  SRes res;
  if (p == 0)
    return SZ_ERROR_MEM;

  res = LzmaEnc_SetProps(p, props);
  if (res == SZ_OK) {
    res = LzmaEnc_WriteProperties(p, propsEncoded, propsSize);
    if (res == SZ_OK)
      res = LzmaEnc_MemEncode(p, dest, destLen, src, srcLen,
                              writeEndMark, progress, alloc, allocBig);
  }

  LzmaEnc_Destroy(p, alloc, allocBig);
  return res;
}